

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

char * compile(char *filename)

{
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar1;
  int *piVar2;
  
  __stream_00 = fopen(filename,"r");
  __stream = _stderr;
  if (__stream_00 != (FILE *)0x0) {
    pcVar1 = cpp((FILE *)__stream_00);
    printf("%s",pcVar1);
    fclose(__stream_00);
    yyin = (FILE *)fopen(filename,"r");
    yyparse();
    return filename;
  }
  piVar2 = __errno_location();
  pcVar1 = strerror(*piVar2);
  fprintf(__stream,"Error: could not open file `%s`: %s\n",filename,pcVar1);
  exit(1);
}

Assistant:

char* compile(char *filename) {
    FILE *file = fopen(filename, "r");
    if(!file) { fprintf(stderr, "Error: could not open file `%s`: %s\n", filename, strerror(errno)); exit(1); }

    char *preprocessed = cpp(file);

    printf("%s", preprocessed);

    fclose(file);
    file = fopen(filename, "r");
    yyin=file;
    yyparse();
    return filename; // Haven't finished processing
}